

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O0

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,BlockStatement *stmt)

{
  iterator pos_00;
  bool bVar1;
  int newState;
  try_emplace_args_t *args;
  equal_to<const_slang::ast::Symbol_*> *this_00;
  StatementList *pSVar2;
  reference ppSVar3;
  size_type sVar4;
  raw_key_type *__y;
  pointer ppVar5;
  iterator piVar6;
  long in_RSI;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_RDI;
  int *branchState;
  iterator __end0;
  iterator __begin0;
  SmallVector<int,_10UL> *__range4_2;
  iterator it_1;
  Statement *s_1;
  iterator __end4_1;
  iterator __begin4_1;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> *__range4_1;
  type_conflict1 finalState;
  int currState;
  Statement *s;
  iterator __end4;
  iterator __begin4;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> *__range4;
  size_t numLocalDecls;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> statements;
  Statement *stmtPtr;
  type_conflict *inserted;
  type *it;
  locator loc;
  size_t pos0;
  size_t hash;
  Symbol **k;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  size_t hash_1;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  Statement *in_stack_fffffffffffffb98;
  AbstractFlowAnalysis<TestAnalysis,_int> *in_stack_fffffffffffffba0;
  span<const_slang::ast::Statement_*,_18446744073709551615UL> *in_stack_fffffffffffffba8;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> *in_stack_fffffffffffffbb0;
  Symbol **ppSVar7;
  try_emplace_args_t *in_stack_fffffffffffffbb8;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *pfVar8;
  size_t in_stack_fffffffffffffbc0;
  size_t in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  SmallVector<int,_10UL> *in_stack_fffffffffffffbe0;
  raw_key_type *in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbf0;
  uint in_stack_fffffffffffffbf4;
  Statement *args_2;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *pfVar9;
  table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
  *in_stack_fffffffffffffc30;
  int *local_3a0;
  Symbol *local_390;
  char_pointer local_388;
  table_element_pointer local_380;
  Statement *local_378;
  Statement **local_370;
  __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
  local_368;
  pointer *local_360;
  int local_358;
  int local_354;
  span<const_slang::ast::Statement_*const,_18446744073709551615UL> local_350;
  Statement *local_340;
  Statement **local_338;
  __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
  local_330;
  pointer *local_328;
  long local_320;
  pointer local_308;
  size_t local_300;
  undefined8 local_2f8;
  type_conflict *local_2f0;
  type *local_2e8;
  Statement local_2d0 [2];
  undefined8 local_290;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
  local_288;
  long local_270;
  Statement *local_260;
  undefined8 *local_258;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_250;
  Symbol **local_248;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_240;
  char_pointer local_238;
  table_element_pointer local_230;
  char_pointer local_228;
  table_element_pointer local_220;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_218;
  char_pointer local_210;
  table_element_pointer local_208;
  undefined1 *local_200;
  undefined1 local_1f1;
  Statement *local_1f0;
  undefined8 *local_1e8;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_1e0;
  bool local_1d1 [25];
  iterator local_1b8;
  bool local_1a1 [25];
  iterator local_188;
  bool local_171;
  iterator local_170;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>
  local_160;
  size_t local_148;
  try_emplace_args_t *local_140;
  SmallVector<int,_10UL> *local_138;
  Statement *local_130;
  undefined8 *local_128;
  undefined1 *local_120;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_118;
  uint local_10c;
  value_type *local_108;
  value_type *local_100;
  uint local_f4;
  group_type *local_f0;
  size_t local_e8;
  pow2_quadratic_prober local_e0;
  try_emplace_args_t *local_d0;
  size_t local_c8;
  SmallVector<int,_10UL> *local_c0;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_b8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>
  local_b0;
  Symbol **local_98;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_90;
  iterator local_88;
  size_t local_78;
  Symbol **local_70;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  Symbol **local_10;
  flat_hash_map<const_Symbol_*,_SmallVector<int>_> *local_8;
  
  local_270 = in_RSI;
  if (*(long *)(in_RSI + 0x28) != 0) {
    pfVar9 = &in_RDI->disableBranches;
    local_290 = *(undefined8 *)(in_RSI + 0x28);
    args_2 = local_2d0;
    SmallVector<int,_10UL>::SmallVector((SmallVector<int,_10UL> *)0x241103);
    local_258 = &local_290;
    local_120 = &local_1f1;
    local_260 = args_2;
    local_250 = pfVar9;
    local_1f0 = args_2;
    local_1e8 = local_258;
    local_1e0 = pfVar9;
    local_130 = args_2;
    local_128 = local_258;
    local_118 = pfVar9;
    local_138 = (SmallVector<int,_10UL> *)
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
                ::key_from<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>(local_258,args_2)
    ;
    args = (try_emplace_args_t *)
           boost::unordered::detail::foa::
           table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
           ::hash_for<slang::ast::Symbol_const*>
                     ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                       *)in_stack_fffffffffffffba0,(Symbol **)in_stack_fffffffffffffb98);
    local_140 = args;
    local_148 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                                *)in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
    local_c0 = local_138;
    local_d0 = local_140;
    pfVar8 = pfVar9;
    local_c8 = local_148;
    local_b8 = pfVar9;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_e0,local_148)
    ;
    do {
      local_e8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_e0);
      local_f0 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                           *)0x2412a3);
      local_f0 = local_f0 + local_e8;
      in_stack_fffffffffffffbf4 =
           boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           match((group15<boost::unordered::detail::foa::plain_integral> *)in_stack_fffffffffffffba8
                 ,(size_t)in_stack_fffffffffffffba0);
      local_f4 = in_stack_fffffffffffffbf4;
      if (in_stack_fffffffffffffbf4 != 0) {
        local_100 = boost::unordered::detail::foa::
                    table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                    ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                                *)0x2412f8);
        local_108 = local_100 + local_e8 * 0xf;
        do {
          local_10c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          this_00 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                    ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                            *)0x241348);
          in_stack_fffffffffffffbe0 = local_c0;
          in_stack_fffffffffffffbe8 =
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
               ::key_from<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>
                         ((pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_> *)
                          0x241376);
          bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                            (this_00,(Symbol **)in_stack_fffffffffffffbe0,in_stack_fffffffffffffbe8)
          ;
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>
            ::table_locator(&local_160,local_f0,local_10c,local_108 + local_10c);
            goto LAB_0024147d;
          }
          local_f4 = local_f4 - 1 & local_f4;
        } while (local_f4 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      in_stack_fffffffffffffbd4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffbd4);
      if (bVar1) {
        memset(&local_160,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>
        ::table_locator(&local_160);
        goto LAB_0024147d;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_e0,
                         (pfVar9->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                         .arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_160,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>
    ::table_locator(&local_160);
LAB_0024147d:
    bVar1 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                      ((table_locator *)&local_160);
    if (bVar1) {
      local_170 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                  ::make_iterator((locator *)0x24149f);
      local_171 = false;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_170,&local_171);
    }
    else if ((pfVar8->table_).
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
             .size_ctrl.size <
             (pfVar8->table_).
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
             .size_ctrl.ml) {
      in_stack_fffffffffffffb98 = local_130;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
      ::
      unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
                ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (Symbol **)in_stack_fffffffffffffbb0,in_stack_fffffffffffffbe0);
      local_188 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                  ::make_iterator((locator *)0x241541);
      local_1a1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_188,local_1a1);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>
                (in_stack_fffffffffffffc30,(size_t)in_RDI,args,(Symbol **)pfVar8,
                 (SmallVector<int,_10UL> *)args_2);
      local_1b8 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                  ::make_iterator((locator *)0x2415bc);
      local_1d1[0] = true;
      std::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
      ::
      pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool,_true>
                (&local_288,&local_1b8,local_1d1);
    }
    SmallVector<int,_10UL>::~SmallVector((SmallVector<int,_10UL> *)0x241604);
    local_2e8 = std::
                get<0ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                            *)0x241611);
    local_2f0 = std::
                get<1ul,boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>*,false>,bool>
                          ((pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>,_bool>
                            *)0x241626);
  }
  if (*(int *)(local_270 + 0x30) == 0) {
    visit<slang::ast::Statement>(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
  }
  else {
    local_2f8 = *(undefined8 *)(local_270 + 0x20);
    if (**(int **)(local_270 + 0x20) == 2) {
      pSVar2 = ast::Statement::as<slang::ast::StatementList>(*(Statement **)(local_270 + 0x20));
      local_308 = (pSVar2->list)._M_ptr;
      local_300 = (pSVar2->list)._M_extent._M_extent_value;
    }
    else {
      std::span<const_slang::ast::Statement_*,_18446744073709551615UL>::
      span<const_slang::ast::Statement_**>
                ((span<const_slang::ast::Statement_*,_18446744073709551615UL> *)
                 in_stack_fffffffffffffbb0,(Statement **)in_stack_fffffffffffffba8,
                 (size_type)in_stack_fffffffffffffba0);
      std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::
      span<const_slang::ast::Statement_*,_18446744073709551615UL>
                (in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    }
    local_320 = 0;
    local_328 = &local_308;
    local_330._M_current =
         (Statement **)
         std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffb98);
    local_338 = (Statement **)
                std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::end
                          ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                           in_stack_fffffffffffffba8);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffba0,
                              (__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffb98), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                ::operator*(&local_330);
      local_340 = *ppSVar3;
      if (local_340->kind != VariableDeclaration) break;
      visit<slang::ast::Statement>(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      local_320 = local_320 + 1;
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
      ::operator++(&local_330);
    }
    local_350 = std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::subspan
                          (in_stack_fffffffffffffbb0,(size_type)in_stack_fffffffffffffba8,
                           (size_type)in_stack_fffffffffffffba0);
    local_308 = local_350._M_ptr;
    local_300 = local_350._M_extent._M_extent_value;
    local_354 = TestAnalysis::copyState((TestAnalysis *)in_RDI,&in_RDI->state);
    local_358 = in_RDI->state;
    local_360 = &local_308;
    local_368._M_current =
         (Statement **)
         std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::begin
                   ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                    in_stack_fffffffffffffb98);
    local_370 = (Statement **)
                std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::end
                          ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                           in_stack_fffffffffffffba8);
    while (bVar1 = __gnu_cxx::
                   operator==<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                             ((__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffba0,
                              (__normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                               *)in_stack_fffffffffffffb98), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
                ::operator*(&local_368);
      local_378 = *ppSVar3;
      newState = TestAnalysis::copyState((TestAnalysis *)in_RDI,&local_354);
      setState(in_RDI,newState);
      visit<slang::ast::Statement>(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
      if (*(int *)(local_270 + 0x30) == 1) {
        TestAnalysis::meetState
                  ((TestAnalysis *)in_stack_fffffffffffffba0,(int *)in_stack_fffffffffffffb98,
                   (int *)0x24198c);
      }
      else if (*(int *)(local_270 + 0x30) == 2) {
        sVar4 = std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>::size
                          ((span<const_slang::ast::Statement_*const,_18446744073709551615UL> *)
                           0x241925);
        if (sVar4 == 1) {
          TestAnalysis::meetState
                    ((TestAnalysis *)in_stack_fffffffffffffba0,(int *)in_stack_fffffffffffffb98,
                     (int *)0x24194a);
        }
        else {
          TestAnalysis::joinState((TestAnalysis *)in_RDI,&local_358,&in_RDI->state);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_slang::ast::Statement_*const_*,_std::span<const_slang::ast::Statement_*const,_18446744073709551615UL>_>
      ::operator++(&local_368);
    }
    setState(in_RDI,local_358);
  }
  if (*(long *)(local_270 + 0x28) != 0) {
    pfVar8 = &in_RDI->disableBranches;
    local_390 = *(Symbol **)(local_270 + 0x28);
    local_248 = &local_390;
    local_240 = pfVar8;
    local_98 = local_248;
    local_90 = pfVar8;
    local_70 = local_248;
    local_68 = pfVar8;
    local_78 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
               ::hash_for<slang::ast::Symbol_const*>
                         ((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                           *)in_stack_fffffffffffffba0,(Symbol **)in_stack_fffffffffffffb98);
    ppSVar7 = local_70;
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                               *)in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
    local_20 = local_78;
    local_10 = ppSVar7;
    local_8 = pfVar8;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                 ::groups((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                           *)0x241afc);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            in_stack_fffffffffffffba8,(size_t)in_stack_fffffffffffffba0);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                   ::elements((table_arrays<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                               *)0x241b47);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          in_stack_fffffffffffffba8 =
               (span<const_slang::ast::Statement_*,_18446744073709551615UL> *)
               boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
               ::pred((table_core<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                       *)0x241b97);
          ppSVar7 = local_10;
          __y = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<slang::ast::Symbol_const*,slang::SmallVector<int,10ul>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::ast::Symbol_const*,void>,std::equal_to<slang::ast::Symbol_const*>,std::allocator<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>>
                ::key_from<std::pair<slang::ast::Symbol_const*const,slang::SmallVector<int,10ul>>>
                          ((pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_> *)
                           0x241bc4);
          bVar1 = std::equal_to<const_slang::ast::Symbol_*>::operator()
                            ((equal_to<const_slang::ast::Symbol_*> *)in_stack_fffffffffffffba8,
                             ppSVar7,__y);
          if (bVar1) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>
            ::table_locator(&local_b0,local_40,local_5c,local_58 + local_5c);
            goto LAB_00241cb8;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar1 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffffba0,(size_t)in_stack_fffffffffffffb98);
      if (bVar1) {
        memset(&local_b0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>
        ::table_locator(&local_b0);
        goto LAB_00241cb8;
      }
      bVar1 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,
                         (pfVar8->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int>_>,_slang::hash<const_slang::ast::Symbol_*>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int>_>_>_>
                         .arrays.groups_size_mask);
    } while (bVar1);
    memset(&local_b0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>
    ::table_locator(&local_b0);
LAB_00241cb8:
    local_88 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
               ::make_iterator((locator *)0x241cc5);
    local_238 = local_88.pc_;
    local_230 = local_88.p_;
    local_388 = local_88.pc_;
    local_380 = local_88.p_;
    ppVar5 = boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
             ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                           *)in_stack_fffffffffffffba0);
    local_3a0 = SmallVectorBase<int>::begin(&(ppVar5->second).super_SmallVectorBase<int>);
    piVar6 = SmallVectorBase<int>::end(&(ppVar5->second).super_SmallVectorBase<int>);
    for (; local_3a0 != piVar6; local_3a0 = local_3a0 + 1) {
      TestAnalysis::joinState((TestAnalysis *)in_RDI,&in_RDI->state,local_3a0);
    }
    local_218 = &in_RDI->disableBranches;
    local_200 = &stack0xfffffffffffffc30;
    local_210 = local_388;
    local_208 = local_380;
    local_228 = local_388;
    local_220 = local_380;
    pos_00.p_._0_4_ = in_stack_fffffffffffffbf0;
    pos_00.pc_ = (char_pointer)in_stack_fffffffffffffbe8;
    pos_00.p_._4_4_ = in_stack_fffffffffffffbf4;
    boost::unordered::detail::foa::
    table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
    ::erase<false,_nullptr>
              ((table<boost::unordered::detail::foa::flat_map_types<const_slang::ast::Symbol_*,_slang::SmallVector<int,_10UL>_>,_slang::hash<const_slang::ast::Symbol_*,_void>,_std::equal_to<const_slang::ast::Symbol_*>,_std::allocator<std::pair<const_slang::ast::Symbol_*const,_slang::SmallVector<int,_10UL>_>_>_>
                *)in_stack_fffffffffffffbe0,pos_00);
  }
  return;
}

Assistant:

void visitStmt(const BlockStatement& stmt) {
        // This block could be the target of a disable statement.
        if (stmt.blockSymbol) {
            auto [it, inserted] = disableBranches.try_emplace(stmt.blockSymbol,
                                                              SmallVector<TState>{});
            SLANG_ASSERT(inserted);
        }

        if (stmt.blockKind == StatementBlockKind::Sequential) {
            visit(stmt.body);
        }
        else {
            auto stmtPtr = &stmt.body;
            auto statements = stmt.body.kind == StatementKind::List
                                  ? stmt.body.as<StatementList>().list
                                  : std::span(&stmtPtr, 1);
            size_t numLocalDecls = 0;
            for (auto s : statements) {
                // Variable declaration initializers happen before
                // we fork the remaining statements.
                if (s->kind == StatementKind::VariableDeclaration) {
                    visit(*s);
                    numLocalDecls++;
                }
                else {
                    break;
                }
            }
            statements = statements.subspan(numLocalDecls);

            // Each remaining statement is executed in parallel.
            auto currState = (DERIVED).copyState(state);
            auto finalState = std::move(state);
            for (auto s : statements) {
                setState((DERIVED).copyState(currState));
                visit(*s);

                switch (stmt.blockKind) {
                    case StatementBlockKind::JoinAny:
                        // If there's only one statement (a pathological case)
                        // then we can meet it; otherwise we must join since
                        // there is uncertainty about which path was taken.
                        if (statements.size() == 1)
                            (DERIVED).meetState(finalState, state);
                        else
                            (DERIVED).joinState(finalState, state);
                        break;
                    case StatementBlockKind::JoinAll:
                        // All paths must be taken, so we meet the states.
                        (DERIVED).meetState(finalState, state);
                        break;
                    case StatementBlockKind::JoinNone:
                        // No paths will be taken by the time the fork
                        // moves on so we discard this state.
                        break;
                    default:
                        SLANG_UNREACHABLE;
                }
            }
            setState(std::move(finalState));
        }

        // Once we're done with a block we remove it as a disable target.
        // A disable statement can target any block in the hierarchy but
        // we don't analyze the control flow implications for targets that
        // aren't part of the current execution stack.
        if (stmt.blockSymbol) {
            auto it = disableBranches.find(stmt.blockSymbol);
            SLANG_ASSERT(it != disableBranches.end());

            for (auto& branchState : it->second)
                (DERIVED).joinState(state, branchState);

            disableBranches.erase(it);
        }
    }